

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void uv__run_timers(uv_loop_t *loop)

{
  heap_node *phVar1;
  heap_node **handle_00;
  uv_timer_t *handle;
  heap_node *heap_node;
  uv_loop_t *loop_local;
  
  while ((phVar1 = heap_min((heap *)&loop->timer_heap), phVar1 != (heap_node *)0x0 &&
         (handle_00 = &phVar1[-5].parent, phVar1[1].left <= (heap_node *)loop->time))) {
    uv_timer_stop((uv_timer_t *)handle_00);
    uv_timer_again((uv_timer_t *)handle_00);
    (*(code *)phVar1[-1].parent)(handle_00);
  }
  return;
}

Assistant:

void uv__run_timers(uv_loop_t* loop) {
  struct heap_node* heap_node;
  uv_timer_t* handle;

  for (;;) {
    heap_node = heap_min((struct heap*) &loop->timer_heap);
    if (heap_node == NULL)
      break;

    handle = container_of(heap_node, uv_timer_t, heap_node);
    if (handle->timeout > loop->time)
      break;

    uv_timer_stop(handle);
    uv_timer_again(handle);
    handle->timer_cb(handle);
  }
}